

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>::
Data(Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
     *this,Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
           *other)

{
  Entry *pEVar1;
  uchar *puVar2;
  byte bVar3;
  Span *pSVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  quintptr qVar7;
  QAbstractItemModel *pQVar8;
  Mapping *pMVar9;
  Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*> *pNVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  R_conflict7 RVar14;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar12 = other->numBuckets;
  sVar13 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar13;
  this->spans = (Span *)0x0;
  RVar14 = allocateSpans(sVar12);
  this->spans = (Span *)RVar14.spans;
  if (RVar14.nSpans != 0) {
    lVar11 = 0;
    sVar12 = 0;
    do {
      pSVar4 = other->spans;
      sVar13 = 0;
      do {
        bVar3 = pSVar4->offsets[sVar13 + lVar11];
        if (bVar3 != 0xff) {
          pEVar5 = pSVar4[sVar12].entries;
          pNVar10 = Span<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
                    ::insert(this->spans + sVar12,sVar13);
          pEVar1 = pEVar5 + bVar3;
          uVar6 = *(undefined8 *)(pEVar1->storage).data;
          qVar7 = *(quintptr *)((pEVar1->storage).data + 8);
          puVar2 = pEVar5[bVar3].storage.data + 0x10;
          pQVar8 = *(QAbstractItemModel **)puVar2;
          pMVar9 = *(Mapping **)(puVar2 + 8);
          (pNVar10->key).index.r = (int)uVar6;
          (pNVar10->key).index.c = (int)((ulong)uVar6 >> 0x20);
          (pNVar10->key).index.i = qVar7;
          (pNVar10->key).index.m.ptr = pQVar8;
          pNVar10->value = pMVar9;
        }
        sVar13 = sVar13 + 1;
      } while (sVar13 != 0x80);
      sVar12 = sVar12 + 1;
      lVar11 = lVar11 + 0x90;
    } while (sVar12 != RVar14.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }